

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_snode.c
# Opt level: O2

void relax_snode(int n,int *et,int relax_columns,int *descendants,int *relax_end)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  ifill(relax_end,n,-1);
  uVar4 = 0;
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    descendants[uVar4] = 0;
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar3 = et[uVar4];
    if (iVar3 != n) {
      descendants[iVar3] = descendants[uVar4] + descendants[iVar3] + 1;
    }
  }
  iVar3 = 0;
  do {
    if (n <= iVar3) {
      return;
    }
    lVar5 = (long)iVar3;
    lVar6 = lVar5;
    iVar1 = iVar3;
    do {
      iVar3 = iVar1;
      iVar1 = et[lVar6];
      if (iVar1 == n) break;
      lVar6 = (long)iVar1;
    } while (descendants[lVar6] < relax_columns);
    relax_end[lVar5] = iVar3;
    lVar6 = (long)iVar3;
    do {
      lVar6 = lVar6 + 1;
      iVar3 = iVar3 + 1;
      if (descendants[lVar6] == 0) break;
    } while (lVar6 < n);
  } while( true );
}

Assistant:

void
relax_snode (
	     const     int n,
                  const int *et,           /* column elimination tree */
	     const int relax_columns, /* max no of columns allowed in a
					 relaxed snode */
	     int       *descendants,  /* no of descendants of each node
					 in the etree */
	     int       *relax_end     /* last column in a supernode */
	     )
{

    register int j, parent;
    register int snode_start;	/* beginning of a snode */
    
    ifill (relax_end, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;

    /* Compute the number of descendants of each node in the etree */
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for (j = 0; j < n; ) { 
     	parent = et[j];
        snode_start = j;
 	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode with j being the last column. */
	relax_end[snode_start] = j;		/* Last column is recorded */
	j++;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }

    /*printf("No of relaxed snodes: %d; relaxed columns: %d\n", 
		nsuper, no_relaxed_col); */
}